

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O1

size_t scriptint_to_bytes(int64_t signed_v,uchar *bytes_out)

{
  uchar uVar1;
  size_t sVar2;
  ulong uVar3;
  bool bVar4;
  
  if (signed_v == 0) {
    bVar4 = true;
    sVar2 = 0;
  }
  else {
    uVar3 = -signed_v;
    if (0 < signed_v) {
      uVar3 = signed_v;
    }
    sVar2 = 0;
    do {
      uVar1 = (uchar)uVar3;
      bytes_out[sVar2] = uVar1;
      sVar2 = sVar2 + 1;
      bVar4 = 0xff < uVar3;
      uVar3 = uVar3 >> 8;
    } while (bVar4);
    bVar4 = -1 < (char)uVar1;
    bytes_out = bytes_out + sVar2;
  }
  if (bVar4) {
    if (-1 < signed_v) {
      return sVar2;
    }
    bytes_out[-1] = bytes_out[-1] | 0x80;
    return sVar2;
  }
  *bytes_out = (byte)((ulong)signed_v >> 0x38) & 0x80;
  return sVar2 + 1;
}

Assistant:

size_t scriptint_to_bytes(int64_t signed_v, unsigned char *bytes_out)
{
    uint64_t v = signed_v < 0 ? -signed_v : signed_v;
    size_t len = 0;
    unsigned char last = 0;

    while (v) {
        last = v & 0xff;
        *bytes_out++ = last;
        len += 1;
        v >>= 8;
    }
    if (last & 0x80) {
        *bytes_out = signed_v < 0 ? 0x80 : 0;
        ++len;
    } else if (signed_v < 0)
        bytes_out[-1] |= 0x80;
    return len;
}